

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::getResolveDimensions
          (LayeredRenderCase *this,LayeredRenderTargetType target)

{
  LayeredRenderTargetType target_local;
  
  switch(target) {
  case TARGET_CUBE:
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,0x40,0x40);
    break;
  case TARGET_3D:
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,0x40,0x40);
    break;
  case TARGET_1D_ARRAY:
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,0x40,1);
    break;
  case TARGET_2D_ARRAY:
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,0x40,0x40);
    break;
  case TARGET_2D_MS_ARRAY:
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,0x40,0x40);
    break;
  default:
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,0,0);
  }
  return (IVec2)(int  [2])this;
}

Assistant:

tcu::IVec2 LayeredRenderCase::getResolveDimensions (LayeredRenderTargetType target)
{
	switch (target)
	{
		case TARGET_CUBE:			return tcu::IVec2(64, 64);
		case TARGET_3D:				return tcu::IVec2(64, 64);
		case TARGET_1D_ARRAY:		return tcu::IVec2(64, 1);
		case TARGET_2D_ARRAY:		return tcu::IVec2(64, 64);
		case TARGET_2D_MS_ARRAY:	return tcu::IVec2(64, 64);
		default:
			DE_ASSERT(DE_FALSE);
			return tcu::IVec2(0, 0);
	}
}